

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

void __thiscall wasm::Wasm2JSGlue::emitPostES6(Wasm2JSGlue *this)

{
  Name *pNVar1;
  __node_base_ptr *name;
  char cVar2;
  ExternalKind EVar3;
  pointer puVar4;
  _Head_base<0UL,_wasm::Function_*,_false> _Var5;
  char *pcVar6;
  pointer puVar7;
  _Head_base<0UL,_wasm::Memory_*,_false> _Var8;
  pointer puVar9;
  _Head_base<0UL,_wasm::Table_*,_false> _Var10;
  _Head_base<0UL,_wasm::Export_*,_false> _Var11;
  long lVar12;
  Wasm2JSGlue *pWVar13;
  ostream *poVar14;
  size_type sVar15;
  Module *pMVar16;
  Module *pMVar17;
  iterator __end2_1;
  pointer puVar18;
  iterator __end2;
  pointer puVar19;
  long lVar20;
  iterator __begin2;
  pointer puVar21;
  pointer puVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar31;
  int iVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  Name name_00;
  Name name_01;
  Name name_02;
  Name name_03;
  undefined1 local_270 [8];
  ostringstream export_name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260 [6];
  ios_base local_200 [264];
  undefined1 local_f8 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  seenModules;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  pointer local_a0;
  string local_98;
  string local_78;
  Wasm2JSGlue *local_58;
  string local_50;
  
  pMVar17 = this->wasm;
  puVar19 = (pMVar17->memories).
            super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((puVar19 !=
       (pMVar17->memories).
       super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (*(char **)((long)&((puVar19->_M_t).
                         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                         super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->
                        super_Importable + 0x20) != (char *)0x0)) {
    poVar14 = &this->out->out;
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"var mem",7);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14,(this->moduleName).super_IString.str._M_str,
                         (this->moduleName).super_IString.str._M_len);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," = new ArrayBuffer(",0x13);
    poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,");\n",3);
  }
  poVar14 = &this->out->out;
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"var ret",7);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,(this->moduleName).super_IString.str._M_str,
                       (this->moduleName).super_IString.str._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14," = ",3);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,(this->moduleName).super_IString.str._M_str,
                       (this->moduleName).super_IString.str._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"({\n",3);
  local_f8 = (undefined1  [8])&seenModules._M_h._M_rehash_policy._M_next_resize;
  seenModules._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
  seenModules._M_h._M_bucket_count = 0;
  seenModules._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  seenModules._M_h._M_element_count._0_4_ = 0x3f800000;
  seenModules._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  seenModules._M_h._M_rehash_policy._4_4_ = 0;
  seenModules._M_h._M_rehash_policy._M_next_resize = 0;
  pMVar16 = this->wasm;
  puVar21 = (pMVar16->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (pMVar16->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = this;
  if (puVar21 != puVar4) {
    do {
      _Var5._M_head_impl =
           (puVar21->_M_t).
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(_Var5._M_head_impl)->super_Importable + 0x20) != (char *)0x0) {
        pcVar6 = *(char **)((long)&(_Var5._M_head_impl)->super_Importable + 0x30);
        iVar31 = (int)pcVar6;
        iVar32 = (int)((ulong)pcVar6 >> 0x20);
        pMVar17 = (Module *)CONCAT71(0xda89,DAT_00da8920 == pcVar6);
        auVar38._0_4_ = -(uint)((int)DAT_00da8900 == iVar31);
        auVar38._4_4_ = -(uint)((int)((ulong)DAT_00da8900 >> 0x20) == iVar32);
        auVar38._8_4_ = -(uint)((int)DAT_00da88c0 == iVar31);
        auVar38._12_4_ = -(uint)((int)((ulong)DAT_00da88c0 >> 0x20) == iVar32);
        auVar46._4_4_ = auVar38._0_4_;
        auVar46._0_4_ = auVar38._4_4_;
        auVar46._8_4_ = auVar38._12_4_;
        auVar46._12_4_ = auVar38._8_4_;
        auVar40._0_4_ = -(uint)((int)DAT_00da88a0 == iVar31);
        auVar40._4_4_ = -(uint)((int)((ulong)DAT_00da88a0 >> 0x20) == iVar32);
        auVar40._8_4_ = -(uint)((int)DAT_00da88b0 == iVar31);
        auVar40._12_4_ = -(uint)((int)((ulong)DAT_00da88b0 >> 0x20) == iVar32);
        auVar39._4_4_ = auVar40._0_4_;
        auVar39._0_4_ = auVar40._4_4_;
        auVar39._8_4_ = auVar40._12_4_;
        auVar39._12_4_ = auVar40._8_4_;
        auVar40 = packssdw(auVar39 & auVar40,auVar46 & auVar38);
        auVar43._0_4_ = -(uint)((int)DAT_00da8880 == iVar31);
        auVar43._4_4_ = -(uint)((int)((ulong)DAT_00da8880 >> 0x20) == iVar32);
        auVar43._8_4_ = -(uint)((int)DAT_00da8890 == iVar31);
        auVar43._12_4_ = -(uint)((int)((ulong)DAT_00da8890 >> 0x20) == iVar32);
        auVar33._4_4_ = auVar43._0_4_;
        auVar33._0_4_ = auVar43._4_4_;
        auVar33._8_4_ = auVar43._12_4_;
        auVar33._12_4_ = auVar43._8_4_;
        auVar26._0_4_ = -(uint)((int)DAT_00da8860 == iVar31);
        auVar26._4_4_ = -(uint)((int)((ulong)DAT_00da8860 >> 0x20) == iVar32);
        auVar26._8_4_ = -(uint)((int)DAT_00da8870 == iVar31);
        auVar26._12_4_ = -(uint)((int)((ulong)DAT_00da8870 >> 0x20) == iVar32);
        auVar25._4_4_ = auVar26._0_4_;
        auVar25._0_4_ = auVar26._4_4_;
        auVar25._8_4_ = auVar26._12_4_;
        auVar25._12_4_ = auVar26._8_4_;
        auVar26 = packssdw(auVar25 & auVar26,auVar33 & auVar43);
        auVar26 = packssdw(auVar26,auVar40);
        if ((((((((((((auVar26 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar26 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar26 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar26 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar26 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar26 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar26 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar26[0xf]) && (DAT_00da88d0 != pcVar6)) && (DAT_00da88e0 != pcVar6)) &&
            ((DAT_00da88f0 != pcVar6 && (DAT_00da8910 != pcVar6)))) &&
           ((DAT_00da8920 != pcVar6 &&
            (pMVar17 = (Module *)&ABI::wasm2js::TRAP, DAT_00da8930 != pcVar6)))) {
          pNVar1 = (Name *)((long)&(_Var5._M_head_impl)->super_Importable + 0x18);
          sVar15 = std::
                   _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)local_f8,pNVar1);
          if (sVar15 == 0) {
            poVar14 = &local_58->out->out;
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,"  \"",3);
            name_00.super_IString.str._M_str = (char *)pMVar17;
            name_00.super_IString.str._M_len =
                 (size_t)*(char **)((long)&(_Var5._M_head_impl)->super_Importable + 0x20);
            poVar14 = wasm::operator<<((wasm *)poVar14,
                                       *(ostream **)
                                        &((Name *)((long)&(_Var5._M_head_impl)->super_Importable +
                                                  0x18))->super_IString,name_00);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\": ",3);
            pcVar6 = *(char **)((long)&(_Var5._M_head_impl)->super_Importable + 0x20);
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,pcVar6,
                       pcVar6 + *(long *)&((Name *)((long)&(_Var5._M_head_impl)->super_Importable +
                                                   0x18))->super_IString);
            asmangle((string *)local_270,&local_50);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar14,(char *)local_270,_export_name);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,",\n",2);
            if (local_270 != (undefined1  [8])local_260) {
              operator_delete((void *)local_270,local_260[0]._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            local_270 = (undefined1  [8])local_f8;
            std::
            _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                      ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)local_270,pNVar1,local_270);
          }
        }
      }
      puVar21 = puVar21 + 1;
    } while (puVar21 != puVar4);
    pMVar16 = local_58->wasm;
  }
  puVar19 = (pMVar16->memories).
            super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar7 = (pMVar16->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar19 != puVar7) {
    do {
      _Var8._M_head_impl =
           (puVar19->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
           _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
           super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
      if (*(char **)((long)&(_Var8._M_head_impl)->super_Importable + 0x20) != (char *)0x0) {
        pcVar6 = *(char **)((long)&(_Var8._M_head_impl)->super_Importable + 0x30);
        iVar31 = (int)pcVar6;
        iVar32 = (int)((ulong)pcVar6 >> 0x20);
        pMVar17 = (Module *)CONCAT71(0xda89,DAT_00da8920 == pcVar6);
        auVar41._0_4_ = -(uint)((int)DAT_00da8900 == iVar31);
        auVar41._4_4_ = -(uint)((int)((ulong)DAT_00da8900 >> 0x20) == iVar32);
        auVar41._8_4_ = -(uint)((int)DAT_00da88c0 == iVar31);
        auVar41._12_4_ = -(uint)((int)((ulong)DAT_00da88c0 >> 0x20) == iVar32);
        auVar47._4_4_ = auVar41._0_4_;
        auVar47._0_4_ = auVar41._4_4_;
        auVar47._8_4_ = auVar41._12_4_;
        auVar47._12_4_ = auVar41._8_4_;
        auVar34._0_4_ = -(uint)((int)DAT_00da88a0 == iVar31);
        auVar34._4_4_ = -(uint)((int)((ulong)DAT_00da88a0 >> 0x20) == iVar32);
        auVar34._8_4_ = -(uint)((int)DAT_00da88b0 == iVar31);
        auVar34._12_4_ = -(uint)((int)((ulong)DAT_00da88b0 >> 0x20) == iVar32);
        auVar42._4_4_ = auVar34._0_4_;
        auVar42._0_4_ = auVar34._4_4_;
        auVar42._8_4_ = auVar34._12_4_;
        auVar42._12_4_ = auVar34._8_4_;
        auVar43 = packssdw(auVar42 & auVar34,auVar47 & auVar41);
        auVar27._0_4_ = -(uint)((int)DAT_00da8880 == iVar31);
        auVar27._4_4_ = -(uint)((int)((ulong)DAT_00da8880 >> 0x20) == iVar32);
        auVar27._8_4_ = -(uint)((int)DAT_00da8890 == iVar31);
        auVar27._12_4_ = -(uint)((int)((ulong)DAT_00da8890 >> 0x20) == iVar32);
        auVar35._4_4_ = auVar27._0_4_;
        auVar35._0_4_ = auVar27._4_4_;
        auVar35._8_4_ = auVar27._12_4_;
        auVar35._12_4_ = auVar27._8_4_;
        auVar23._0_4_ = -(uint)((int)DAT_00da8860 == iVar31);
        auVar23._4_4_ = -(uint)((int)((ulong)DAT_00da8860 >> 0x20) == iVar32);
        auVar23._8_4_ = -(uint)((int)DAT_00da8870 == iVar31);
        auVar23._12_4_ = -(uint)((int)((ulong)DAT_00da8870 >> 0x20) == iVar32);
        auVar28._4_4_ = auVar23._0_4_;
        auVar28._0_4_ = auVar23._4_4_;
        auVar28._8_4_ = auVar23._12_4_;
        auVar28._12_4_ = auVar23._8_4_;
        auVar26 = packssdw(auVar28 & auVar23,auVar35 & auVar27);
        auVar26 = packssdw(auVar26,auVar43);
        if (((((((((((auVar26 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                    (auVar26 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar26 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar26 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar26 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar26 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar26 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               -1 < auVar26[0xf]) && (DAT_00da88d0 != pcVar6)) &&
            ((DAT_00da88e0 != pcVar6 &&
             (((DAT_00da88f0 != pcVar6 && (DAT_00da8910 != pcVar6)) && (DAT_00da8920 != pcVar6))))))
           && (pMVar17 = (Module *)&ABI::wasm2js::TRAP, DAT_00da8930 != pcVar6)) {
          poVar14 = &local_58->out->out;
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"  \"",3);
          name_01.super_IString.str._M_str = (char *)pMVar17;
          name_01.super_IString.str._M_len =
               (size_t)*(char **)((long)&(_Var8._M_head_impl)->super_Importable + 0x20);
          poVar14 = wasm::operator<<((wasm *)poVar14,
                                     *(ostream **)
                                      &((Name *)((long)&(_Var8._M_head_impl)->super_Importable +
                                                0x18))->super_IString,name_01);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\": {\n",5);
          poVar14 = &local_58->out->out;
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"    ",4);
          pcVar6 = *(char **)((long)&(_Var8._M_head_impl)->super_Importable + 0x30);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,pcVar6,
                     pcVar6 + *(long *)&((Name *)((long)&(_Var8._M_head_impl)->super_Importable +
                                                 0x28))->super_IString);
          asmangle((string *)local_270,&local_50);
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,(char *)local_270,_export_name);
          pWVar13 = local_58;
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,": { buffer : mem",0x10);
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,(pWVar13->moduleName).super_IString.str._M_str,
                               (pWVar13->moduleName).super_IString.str._M_len);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14," }\n",3);
          if (local_270 != (undefined1  [8])local_260) {
            operator_delete((void *)local_270,local_260[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>(&pWVar13->out->out,"  },\n",5);
        }
      }
      puVar19 = puVar19 + 1;
    } while (puVar19 != puVar7);
    pMVar16 = local_58->wasm;
  }
  puVar9 = (pMVar16->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar22 = (pMVar16->tables).
                 super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pWVar13 = local_58, puVar22 != puVar9;
      puVar22 = puVar22 + 1) {
    _Var10._M_head_impl =
         (puVar22->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
         super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
    if (*(char **)((long)&(_Var10._M_head_impl)->super_Importable + 0x20) != (char *)0x0) {
      pcVar6 = *(char **)((long)&(_Var10._M_head_impl)->super_Importable + 0x30);
      iVar31 = (int)pcVar6;
      iVar32 = (int)((ulong)pcVar6 >> 0x20);
      pMVar17 = (Module *)CONCAT71(0xda89,DAT_00da8920 == pcVar6);
      auVar44._0_4_ = -(uint)((int)DAT_00da8900 == iVar31);
      auVar44._4_4_ = -(uint)((int)((ulong)DAT_00da8900 >> 0x20) == iVar32);
      auVar44._8_4_ = -(uint)((int)DAT_00da88c0 == iVar31);
      auVar44._12_4_ = -(uint)((int)((ulong)DAT_00da88c0 >> 0x20) == iVar32);
      auVar48._4_4_ = auVar44._0_4_;
      auVar48._0_4_ = auVar44._4_4_;
      auVar48._8_4_ = auVar44._12_4_;
      auVar48._12_4_ = auVar44._8_4_;
      auVar36._0_4_ = -(uint)((int)DAT_00da88a0 == iVar31);
      auVar36._4_4_ = -(uint)((int)((ulong)DAT_00da88a0 >> 0x20) == iVar32);
      auVar36._8_4_ = -(uint)((int)DAT_00da88b0 == iVar31);
      auVar36._12_4_ = -(uint)((int)((ulong)DAT_00da88b0 >> 0x20) == iVar32);
      auVar45._4_4_ = auVar36._0_4_;
      auVar45._0_4_ = auVar36._4_4_;
      auVar45._8_4_ = auVar36._12_4_;
      auVar45._12_4_ = auVar36._8_4_;
      auVar43 = packssdw(auVar45 & auVar36,auVar48 & auVar44);
      auVar29._0_4_ = -(uint)((int)DAT_00da8880 == iVar31);
      auVar29._4_4_ = -(uint)((int)((ulong)DAT_00da8880 >> 0x20) == iVar32);
      auVar29._8_4_ = -(uint)((int)DAT_00da8890 == iVar31);
      auVar29._12_4_ = -(uint)((int)((ulong)DAT_00da8890 >> 0x20) == iVar32);
      auVar37._4_4_ = auVar29._0_4_;
      auVar37._0_4_ = auVar29._4_4_;
      auVar37._8_4_ = auVar29._12_4_;
      auVar37._12_4_ = auVar29._8_4_;
      auVar24._0_4_ = -(uint)((int)DAT_00da8860 == iVar31);
      auVar24._4_4_ = -(uint)((int)((ulong)DAT_00da8860 >> 0x20) == iVar32);
      auVar24._8_4_ = -(uint)((int)DAT_00da8870 == iVar31);
      auVar24._12_4_ = -(uint)((int)((ulong)DAT_00da8870 >> 0x20) == iVar32);
      auVar30._4_4_ = auVar24._0_4_;
      auVar30._0_4_ = auVar24._4_4_;
      auVar30._8_4_ = auVar24._12_4_;
      auVar30._12_4_ = auVar24._8_4_;
      auVar26 = packssdw(auVar30 & auVar24,auVar37 & auVar29);
      auVar26 = packssdw(auVar26,auVar43);
      if (((((((((((auVar26 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                  (auVar26 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar26 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar26 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar26 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar26 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar26 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             -1 < auVar26[0xf]) && (DAT_00da88d0 != pcVar6)) &&
          ((DAT_00da88e0 != pcVar6 && ((DAT_00da88f0 != pcVar6 && (DAT_00da8910 != pcVar6)))))) &&
         ((DAT_00da8920 != pcVar6 &&
          (pMVar17 = (Module *)&ABI::wasm2js::TRAP, DAT_00da8930 != pcVar6)))) {
        pNVar1 = (Name *)((long)&(_Var10._M_head_impl)->super_Importable + 0x18);
        sVar15 = std::
                 _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)local_f8,pNVar1);
        if (sVar15 == 0) {
          poVar14 = &local_58->out->out;
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"  \"",3);
          name_02.super_IString.str._M_str = (char *)pMVar17;
          name_02.super_IString.str._M_len =
               (size_t)*(char **)((long)&(_Var10._M_head_impl)->super_Importable + 0x20);
          poVar14 = wasm::operator<<((wasm *)poVar14,
                                     *(ostream **)
                                      &((Name *)((long)&(_Var10._M_head_impl)->super_Importable +
                                                0x18))->super_IString,name_02);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\": ",3);
          pcVar6 = *(char **)((long)&(_Var10._M_head_impl)->super_Importable + 0x20);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,pcVar6,
                     pcVar6 + *(long *)&((Name *)((long)&(_Var10._M_head_impl)->super_Importable +
                                                 0x18))->super_IString);
          asmangle((string *)local_270,&local_50);
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,(char *)local_270,_export_name);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,",\n",2);
          if (local_270 != (undefined1  [8])local_260) {
            operator_delete((void *)local_270,local_260[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          local_270 = (undefined1  [8])local_f8;
          std::
          _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                    ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)local_270,pNVar1,local_270);
        }
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(&local_58->out->out,"});\n",4);
  if ((pWVar13->flags).allowAsserts == false) {
    pMVar16 = pWVar13->wasm;
    puVar18 = (pMVar16->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_a0 = (pMVar16->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar18 != local_a0) {
      do {
        EVar3 = ((puVar18->_M_t).
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->kind;
        if (((uint)EVar3 < 4) && (EVar3 != Table)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
          _Var11._M_head_impl =
               (puVar18->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
          lVar12 = *(long *)&(_Var11._M_head_impl)->name;
          if (lVar12 != 0) {
            pcVar6 = *(char **)((long)&(_Var11._M_head_impl)->name + 8);
            lVar20 = 0;
            do {
              cVar2 = pcVar6[lVar20];
              if (cVar2 == '-') {
                local_50._M_dataplus._M_p._0_1_ = 0x5f;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_270,(char *)&local_50,1);
              }
              else {
                local_50._M_dataplus._M_p._0_1_ = cVar2;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_270,(char *)&local_50,1);
              }
              lVar20 = lVar20 + 1;
            } while (lVar12 != lVar20);
          }
          pWVar13 = local_58;
          poVar14 = &local_58->out->out;
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"export var ",0xb);
          _Var11._M_head_impl =
               (puVar18->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
          pcVar6 = *(char **)((long)&(_Var11._M_head_impl)->name + 8);
          name = &seenModules._M_h._M_single_bucket;
          seenModules._M_h._M_single_bucket = (__node_base_ptr)&local_b0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)name,pcVar6,pcVar6 + *(long *)&(_Var11._M_head_impl)->name);
          asmangle(&local_50,(string *)name);
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,local_50._M_dataplus._M_p,local_50._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14," = ret",6);
          name_03.super_IString.str._M_str = (char *)pMVar17;
          name_03.super_IString.str._M_len = (size_t)(pWVar13->moduleName).super_IString.str._M_str;
          poVar14 = wasm::operator<<((wasm *)poVar14,
                                     (ostream *)(pWVar13->moduleName).super_IString.str._M_len,
                                     name_03);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,".",1);
          _Var11._M_head_impl =
               (puVar18->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
          pcVar6 = *(char **)((long)&(_Var11._M_head_impl)->name + 8);
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,pcVar6,pcVar6 + *(long *)&(_Var11._M_head_impl)->name);
          asmangle(&local_98,&local_78);
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,local_98._M_dataplus._M_p,local_98._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\n",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)seenModules._M_h._M_single_bucket != &local_b0) {
            operator_delete(seenModules._M_h._M_single_bucket,local_b0._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_270);
          std::ios_base::~ios_base(local_200);
        }
        puVar18 = puVar18 + 1;
      } while (puVar18 != local_a0);
    }
  }
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_f8);
  return;
}

Assistant:

void Wasm2JSGlue::emitPostES6() {
  // Create an initial `ArrayBuffer` and populate it with static data.
  // Currently we use base64 encoding to encode static data and we decode it at
  // instantiation time.
  //
  // Note that the translation here expects that the lower values of this memory
  // can be used for conversions, so make sure there's at least one page.
  if (!wasm.memories.empty() && wasm.memories[0]->imported()) {
    out << "var mem" << moduleName.str << " = new ArrayBuffer("
        << wasm.memories[0]->initial.addr * Memory::kPageSize << ");\n";
  }

  // Actually invoke the `asmFunc` generated function, passing in all global
  // values followed by all imports
  out << "var ret" << moduleName.str << " = " << moduleName.str << "({\n";

  std::unordered_set<Name> seenModules;

  ModuleUtils::iterImportedFunctions(wasm, [&](Function* import) {
    // The special helpers are emitted in the glue, see code and comments
    // below.
    if (ABI::wasm2js::isHelper(import->base)) {
      return;
    }
    if (seenModules.count(import->module) > 0) {
      return;
    }
    out << "  \"" << import->module
        << "\": " << asmangle(import->module.toString()) << ",\n";
    seenModules.insert(import->module);
  });

  ModuleUtils::iterImportedMemories(wasm, [&](Memory* import) {
    // The special helpers are emitted in the glue, see code and comments
    // below.
    if (ABI::wasm2js::isHelper(import->base)) {
      return;
    }
    out << "  \"" << import->module << "\": {\n";
    out << "    " << asmangle(import->base.toString()) << ": { buffer : mem"
        << moduleName.str << " }\n";
    out << "  },\n";
  });

  ModuleUtils::iterImportedTables(wasm, [&](Table* import) {
    // The special helpers are emitted in the glue, see code and comments
    // below.
    if (ABI::wasm2js::isHelper(import->base)) {
      return;
    }
    if (seenModules.count(import->module) > 0) {
      return;
    }
    out << "  \"" << import->module
        << "\": " << asmangle(import->module.toString()) << ",\n";
    seenModules.insert(import->module);
  });

  out << "});\n";

  if (flags.allowAsserts) {
    return;
  }

  // And now that we have our returned instance, export all our functions
  // that are hanging off it.
  for (auto& exp : wasm.exports) {
    switch (exp->kind) {
      case ExternalKind::Function:
      case ExternalKind::Global:
      case ExternalKind::Memory:
        break;

      // Exported globals and function tables aren't supported yet
      default:
        continue;
    }
    std::ostringstream export_name;
    for (char c : exp->name.str) {
      if (c == '-') {
        export_name << '_';
      } else {
        export_name << c;
      }
    }
    out << "export var " << asmangle(exp->name.toString()) << " = ret"
        << moduleName << "." << asmangle(exp->name.toString()) << ";\n";
  }
}